

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::SocketNetwork::parseAddress(SocketNetwork *this,StringPtr addr,uint portHint)

{
  undefined4 in_register_0000000c;
  anon_class_24_3_6408ca9c local_50;
  undefined1 local_38 [20];
  uint portHint_local;
  SocketNetwork *this_local;
  StringPtr addr_local;
  
  this_local = (SocketNetwork *)addr.content.size_;
  local_50.this = (SocketNetwork *)addr.content.ptr;
  addr_local.content.ptr = (char *)CONCAT44(in_register_0000000c,portHint);
  local_50.addr = (StringPtr *)&this_local;
  local_50.portHint = (uint *)(local_38 + 0xc);
  unique0x10000083 = local_50.this;
  addr_local.content.size_ = (size_t)this;
  evalNow<kj::(anonymous_namespace)::SocketNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda()_1_>
            ((kj *)local_38,&local_50);
  Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>>::
  then<kj::(anonymous_namespace)::SocketNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Array<kj::(anonymous_namespace)::SocketAddress>)_1_>
            ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>> *)this,(Type *)local_38);
  Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::~Promise
            ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint = 0) override {
    return evalNow([&]() {
      return SocketAddress::parse(lowLevel, addr, portHint, filter);
    }).then([this](Array<SocketAddress> addresses) -> Own<NetworkAddress> {
      return heap<NetworkAddressImpl>(lowLevel, filter, kj::mv(addresses));
    });
  }